

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
gtl::internal_btree::
btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
::increment(btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
            *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  *this_local;
  
  bVar1 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::leaf(this->node);
  if (bVar1) {
    iVar3 = this->position + 1;
    this->position = iVar3;
    bVar2 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            ::count(this->node);
    if (iVar3 < (int)(uint)bVar2) {
      return;
    }
  }
  increment_slow(this);
  return;
}

Assistant:

void increment() {
    if (node->leaf() && ++position < node->count()) {
      return;
    }
    increment_slow();
  }